

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileWrite.cpp
# Opt level: O0

bool __thiscall stk::FileWrite::setAifFile(FileWrite *this,string *fileName)

{
  long lVar1;
  char *__filename;
  FILE *pFVar2;
  ostream *poVar3;
  size_t sVar4;
  StkFloat SVar5;
  undefined2 local_be;
  undefined4 local_bc;
  char zeroes_1 [2];
  char type_1 [4];
  char zeroes [2];
  ulong uStack_b0;
  char type [4];
  unsigned_long rate;
  unsigned_long exp;
  undefined8 uStack_98;
  SINT16 i;
  AifSsnd ssnd;
  AifHeader hdr;
  string local_40 [8];
  string name;
  string *fileName_local;
  FileWrite *this_local;
  
  std::__cxx11::string::string(local_40,(string *)fileName);
  lVar1 = std::__cxx11::string::find((char *)fileName,0x11f22d);
  if (lVar1 == -1) {
    std::__cxx11::string::operator+=((string *)fileName,".aif");
  }
  __filename = (char *)std::__cxx11::string::c_str();
  pFVar2 = fopen(__filename,"wb");
  this->fd_ = (FILE *)pFVar2;
  if (this->fd_ == (FILE *)0x0) {
    poVar3 = std::operator<<((ostream *)Stk::oStream__abi_cxx11_,
                             "FileWrite: could not create AIF file: ");
    std::operator<<(poVar3,(string *)fileName);
    this_local._7_1_ = false;
    goto LAB_0011a9e3;
  }
  memcpy(&ssnd.blockSize,&AIFF_0011ef58,0x30);
  uStack_98 = 0x8444e5353;
  ssnd.ssnd[0] = '\0';
  ssnd.ssnd[1] = '\0';
  ssnd.ssnd[2] = '\0';
  ssnd.ssnd[3] = '\0';
  ssnd.ssndSize = 0;
  ssnd.offset = 0;
  hdr.comm._0_2_ = SUB42(this->channels_,0);
  if (this->dataType_ == 1) {
    hdr.sampleFrames._0_2_ = 8;
  }
  else if (this->dataType_ == 2) {
    hdr.sampleFrames._0_2_ = 0x10;
  }
  else if (this->dataType_ == 4) {
    hdr.sampleFrames._0_2_ = 0x18;
  }
  else if (this->dataType_ == 8) {
    hdr.sampleFrames._0_2_ = 0x20;
  }
  else if (this->dataType_ == 0x10) {
    hdr.form[3] = 'C';
    hdr.sampleFrames._0_2_ = 0x20;
    hdr.aiff[0] = '\x18';
    hdr.aiff[1] = '\0';
    hdr.aiff[2] = '\0';
    hdr.aiff[3] = '\0';
  }
  else if (this->dataType_ == 0x20) {
    hdr.form[3] = 'C';
    hdr.sampleFrames._0_2_ = 0x40;
    hdr.aiff[0] = '\x18';
    hdr.aiff[1] = '\0';
    hdr.aiff[2] = '\0';
    hdr.aiff[3] = '\0';
  }
  SVar5 = Stk::sampleRate();
  uStack_b0 = (long)SVar5 | (long)(SVar5 - 9.223372036854776e+18) & (long)SVar5 >> 0x3f;
  memset((void *)((long)&hdr.sampleFrames + 2),0,10);
  rate = uStack_b0;
  exp._6_2_ = 0;
  while ((exp._6_2_ < 0x20 && (rate = rate >> 1, rate != 0))) {
    exp._6_2_ = exp._6_2_ + 1;
  }
  exp._6_2_ = exp._6_2_ + 0x3fff;
  Stk::swap16((uchar *)((long)&exp + 6));
  hdr.sampleFrames._2_2_ = exp._6_2_;
  exp._6_2_ = 0x20;
  for (; (exp._6_2_ != 0 && ((uStack_b0 & 0x80000000) == 0)); uStack_b0 = uStack_b0 << 1) {
    exp._6_2_ = exp._6_2_ + -1;
  }
  Stk::swap32((uchar *)&stack0xffffffffffffff50);
  hdr._28_8_ = uStack_b0;
  this->byteswap_ = false;
  this->byteswap_ = true;
  Stk::swap32((uchar *)((long)&ssnd.blockSize + 4));
  Stk::swap32((uchar *)hdr.aiff);
  Stk::swap16((uchar *)hdr.comm);
  Stk::swap16((uchar *)&hdr.sampleFrames);
  Stk::swap32((uchar *)((long)register0x00000020 + -0x94));
  Stk::swap32((uchar *)&ssnd);
  Stk::swap32((uchar *)&ssnd.offset);
  sVar4 = fwrite(&ssnd.blockSize,4,5,(FILE *)this->fd_);
  if ((((sVar4 == 5) && (sVar4 = fwrite(hdr.comm,2,1,(FILE *)this->fd_), sVar4 == 1)) &&
      (sVar4 = fwrite(&hdr.commSize,4,1,(FILE *)this->fd_), sVar4 == 1)) &&
     ((sVar4 = fwrite(&hdr.sampleFrames,2,1,(FILE *)this->fd_), sVar4 == 1 &&
      (sVar4 = fwrite((void *)((long)&hdr.sampleFrames + 2),10,1,(FILE *)this->fd_), sVar4 == 1))))
  {
    if (this->dataType_ == 0x10) {
      builtin_strncpy(type_1,"fl32",4);
      zeroes_1[0] = '\0';
      zeroes_1[1] = '\0';
      sVar4 = fwrite(type_1,4,1,(FILE *)this->fd_);
      if (sVar4 == 1) {
        sVar4 = fwrite(zeroes_1,2,1,(FILE *)this->fd_);
joined_r0x0011a917:
        if (sVar4 == 1) goto LAB_0011a922;
      }
    }
    else if (this->dataType_ == 0x20) {
      local_bc = 0x34366c66;
      local_be = 0;
      sVar4 = fwrite(&local_bc,4,1,(FILE *)this->fd_);
      if (sVar4 == 1) {
        sVar4 = fwrite(&local_be,2,1,(FILE *)this->fd_);
        goto joined_r0x0011a917;
      }
    }
    else {
LAB_0011a922:
      sVar4 = fwrite(&stack0xffffffffffffff68,4,4,(FILE *)this->fd_);
      if (sVar4 == 4) {
        poVar3 = std::operator<<((ostream *)Stk::oStream__abi_cxx11_,
                                 "FileWrite: creating AIF file: ");
        std::operator<<(poVar3,(string *)fileName);
        Stk::handleError(&this->super_Stk,STATUS);
        this_local._7_1_ = true;
        goto LAB_0011a9e3;
      }
    }
  }
  poVar3 = std::operator<<((ostream *)Stk::oStream__abi_cxx11_,
                           "FileWrite: could not write AIF header for file: ");
  std::operator<<(poVar3,(string *)fileName);
  this_local._7_1_ = false;
LAB_0011a9e3:
  hdr.srate[6] = '\x01';
  hdr.srate[7] = '\0';
  hdr.srate[8] = '\0';
  hdr.srate[9] = '\0';
  std::__cxx11::string::~string(local_40);
  return this_local._7_1_;
}

Assistant:

bool FileWrite :: setAifFile( std::string fileName )
{
  std::string name( fileName );
  if ( fileName.find( ".aif" ) == std::string::npos ) fileName += ".aif";
  fd_ = fopen( fileName.c_str(), "wb" );
  if ( !fd_ ) {
    oStream_ << "FileWrite: could not create AIF file: " << fileName;
    return false;
  }

  // Common parts of AIFF/AIFC header.
  struct AifHeader hdr = {{'F','O','R','M'}, 46, {'A','I','F','F'}, {'C','O','M','M'}, 18, 0, 0, 16, "0"};
  struct AifSsnd ssnd = {{'S','S','N','D'}, 8, 0, 0};
  hdr.nChannels = channels_;
  if ( dataType_ == STK_SINT8 )
    hdr.sampleSize = 8;
  else if ( dataType_ == STK_SINT16 )
    hdr.sampleSize = 16;
  else if ( dataType_ == STK_SINT24 )
    hdr.sampleSize = 24;
  else if ( dataType_ == STK_SINT32 )
    hdr.sampleSize = 32;
  else if ( dataType_ == STK_FLOAT32 ) {
    hdr.aiff[3] = 'C';
    hdr.sampleSize = 32;
    hdr.commSize = 24;
  }
  else if ( dataType_ == STK_FLOAT64 ) {
    hdr.aiff[3] = 'C';
    hdr.sampleSize = 64;
    hdr.commSize = 24;
  }

  // For AIFF files, the sample rate is stored in a 10-byte,
  // IEEE Standard 754 floating point number, so we need to
  // convert to that.
  SINT16 i;
  unsigned long exp;
  unsigned long rate = (unsigned long) Stk::sampleRate();
  memset( hdr.srate, 0, 10 );
  exp = rate;
  for ( i=0; i<32; i++ ) {
    exp >>= 1;
    if ( !exp ) break;
  }
  i += 16383;
#ifdef __LITTLE_ENDIAN__
  swap16((unsigned char *)&i);
#endif
  memcpy( hdr.srate, &i, sizeof(SINT16) );

  for ( i=32; i; i-- ) {
    if ( rate & 0x80000000 ) break;
    rate <<= 1;
  }

#ifdef __LITTLE_ENDIAN__
  swap32((unsigned char *)&rate);
#endif
  memcpy( hdr.srate + 2, &rate, sizeof(rate) );

  byteswap_ = false;  
#ifdef __LITTLE_ENDIAN__
  byteswap_ = true;
  swap32((unsigned char *)&hdr.formSize);
  swap32((unsigned char *)&hdr.commSize);
  swap16((unsigned char *)&hdr.nChannels);
  swap16((unsigned char *)&hdr.sampleSize);
  swap32((unsigned char *)&ssnd.ssndSize);
  swap32((unsigned char *)&ssnd.offset);
  swap32((unsigned char *)&ssnd.blockSize);
#endif

  // The structure boundaries don't allow a single write of 54 bytes.
  if ( fwrite(&hdr, 4, 5, fd_) != 5 ) goto error;
  if ( fwrite(&hdr.nChannels, 2, 1, fd_) != 1 ) goto error;
  if ( fwrite(&hdr.sampleFrames, 4, 1, fd_) != 1 ) goto error;
  if ( fwrite(&hdr.sampleSize, 2, 1, fd_) != 1 ) goto error;
  if ( fwrite(&hdr.srate, 10, 1, fd_) != 1 ) goto error;

  if ( dataType_ == STK_FLOAT32 ) {
    char type[4] = {'f','l','3','2'};
    char zeroes[2] = { 0, 0 };
    if ( fwrite(&type, 4, 1, fd_) != 1 ) goto error;
    if ( fwrite(&zeroes, 2, 1, fd_) != 1 ) goto error;
  }
  else if ( dataType_ == STK_FLOAT64 ) {
    char type[4] = {'f','l','6','4'};
    char zeroes[2] = { 0, 0 };
    if ( fwrite(&type, 4, 1, fd_) != 1 ) goto error;
    if ( fwrite(&zeroes, 2, 1, fd_) != 1 ) goto error;
  }
  
  if ( fwrite(&ssnd, 4, 4, fd_) != 4 ) goto error;

  oStream_ << "FileWrite: creating AIF file: " << fileName;
  handleError( StkError::STATUS );
  return true;

 error:
  oStream_ << "FileWrite: could not write AIF header for file: " << fileName;
  return false;
}